

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O3

int pay(int choice,int num,double income)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  double *pdVar6;
  bool bVar7;
  double extraout_XMM0_Qa;
  double dVar8;
  double input;
  double local_60;
  double local_58;
  double local_40;
  long local_38;
  
  local_38 = (long)choice * 0x38;
  local_60 = (double)num * ITEM[choice].price;
  local_40 = income;
  if (isVIP) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Since you are our VIP, you got 25% off!",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    local_60 = local_60 * 0.75;
  }
  pdVar6 = (double *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------------------------------------------------------------",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Please pay ",0xb);
  poVar5 = std::ostream::_M_insert<double>(local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," yuan",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------------------------------------------------------------",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar3 = 1;
  local_58 = income;
  do {
    std::istream::_M_extract<double>((double *)&std::cin);
    local_58 = local_58 + 0.0;
    dVar8 = local_58;
    if ((local_60 < local_58) && (local_58 - local_60 <= balance)) goto LAB_00103c30;
    if (balance < local_58 - local_60) {
      local_40 = local_58;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sorry, there\'s not enough balance in the machine!",0x31);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Refunding...Please wait...",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      pdVar6 = &balance;
      deal(-1,&local_40,&balance,local_60);
      iVar3 = deal(-1,&local_40,&balance,local_60);
      dVar8 = local_58;
      goto LAB_00103f9c;
    }
    if ((local_58 == local_60) && (!NAN(local_58) && !NAN(local_60))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Payment is successful! Thank you!",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"back",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      balance = local_58 + balance;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      buttonback();
      balance = balance + 0.0;
      return 0;
    }
    if (local_58 < local_60) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sorry! The money you paid is not enough! Please pay more!",
                 0x39);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      iVar3 = -1;
    }
    bVar7 = iVar3 == -1;
    iVar3 = -1;
  } while (bVar7);
  do {
    pay();
    local_60 = extraout_XMM0_Qa;
LAB_00103c30:
    local_40 = dVar8;
    iVar3 = deal(0,&local_40,&balance,local_60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar6,
               "-------------------------------------------------------------------------",0x49);
    cVar2 = (char)pdVar6;
    std::ios::widen((char)*(undefined8 *)((long)*pdVar6 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar6,"Payment is successful! Thank you!",0x21);
    std::ios::widen((char)*(undefined8 *)((long)*pdVar6 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"back",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar6,"Delivering,please wait.",0x17);
    piVar1 = (int *)((long)&ITEM[0].amount + local_38);
    *piVar1 = *piVar1 - num;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar6,
               "-------------------------------------------------------------------------",0x49);
    std::ios::widen((char)*(undefined8 *)((long)*pdVar6 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    pdVar6 = (double *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)((long)*pdVar6 + -0x18) + (char)pdVar6);
    std::ostream::put((char)pdVar6);
    std::ostream::flush();
    buttonback();
LAB_00103f9c:
  } while (iVar3 != 0);
  return 0;
}

Assistant:

int pay(int choice, int num, double income) { //�����ɹ�����0�����󷵻�-1
    double pr = ITEM[choice].price * num, input = 0;
    if (isVIP) {
        cout << "Since you are our VIP, you got 25% off!" << endl;
        pr *= 3.0 / 4;
    }
    int signal, detection, isok = 1;
    frame
    cout << "Please pay " << pr << " yuan" << endl;
    frame
    do {
        cin >> input;
        income += input;
        if (income > pr && income - pr <= balance) {
            signal = 0;
            detection = deal(signal, income, balance, pr);
            frame
            cout << "Payment is successful! Thank you!" << endl << endl << endl << "back" << endl;
            deliver(signal, choice, num);
            isok = 0;
            frame
            buttonback();

        } else if (income - pr > balance) {
            frame
            cout << "Sorry, there's not enough balance in the machine!" << endl << "Refunding...Please wait..." << endl;
            frame
            signal = -1;
            deal(signal, income, balance, pr);
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income == pr) {
            frame
            cout << "Payment is successful! Thank you!" << endl;
            cout << endl << endl << "back" << endl;
            signal = 1;
            deal(signal, income, balance, pr);
            frame
            buttonback();
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income < pr) {
            cout << "Sorry! The money you paid is not enough! Please pay more!" << endl;
            isok = -1;
            /*int button = 1;
          if (button == 2) {
                signal = -1;
                detection = deal(signal, income, balance, pr);
                break;
            }*/
        }
    } while (isok == -1);
    if (detection == isok) {
        return isok;
    } else {
        detect(999);
    }
}